

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::generateTranslatorFederate(CommonCore *this)

{
  string_view name;
  BaseType BVar1;
  route_id rVar2;
  TranslatorFederate *pTVar3;
  CommonCore *in_RDI;
  ActionMessage newFed;
  GlobalFederateId fid;
  undefined4 in_stack_fffffffffffffcf8;
  int32_t in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffd08;
  ActionMessage *M;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffd10;
  function<void_(const_helics::ActionMessage_&)> *in_stack_fffffffffffffd18;
  CommonCore *this_00;
  GlobalFederateId global_fedid;
  function<void_(helics::ActionMessage_&&)> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TranslatorFederate *in_stack_fffffffffffffd30;
  GlobalFederateId local_270;
  BaseType local_26c;
  Core *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb8 [16];
  GlobalFederateId local_234;
  undefined4 local_230;
  GlobalFederateId local_22c;
  ActionMessage local_228;
  undefined1 local_168 [344];
  BaseType local_10;
  GlobalFederateId local_c [3];
  
  local_c[0] = std::atomic<helics::GlobalFederateId>::load(&in_RDI->translatorFedID,seq_cst);
  pTVar3 = (TranslatorFederate *)operator_new(0x3d8);
  local_168[0x127] = '\x01';
  local_10 = local_c[0].gid;
  getIdentifier_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
  local_168._296_4_ = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  TranslatorFederate::TranslatorFederate
            (in_stack_fffffffffffffdb8._0_8_,(GlobalFederateId)in_stack_fffffffffffffdb8._12_4_,
             in_stack_fffffffffffffdb0,(GlobalBrokerId)in_stack_fffffffffffffdb8._8_4_,
             in_stack_fffffffffffffda8);
  local_168[0x127] = '\0';
  in_RDI->translatorFed = pTVar3;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  local_168._280_8_ = std::this_thread::get_id();
  std::atomic<std::thread::id>::store(&in_RDI->translatorThread,(id)local_168._280_8_,seq_cst);
  local_168._276_4_ = local_c[0].gid;
  std::atomic<helics::GlobalFederateId>::store(&in_RDI->translatorFedID,local_c[0],seq_cst);
  std::function<void(helics::ActionMessage_const&)>::
  function<helics::CommonCore::generateTranslatorFederate()::__0,void>
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  std::function<void(helics::ActionMessage&&)>::
  function<helics::CommonCore::generateTranslatorFederate()::__1,void>
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  std::function<void(helics::ActionMessage_const&)>::
  function<helics::CommonCore::generateTranslatorFederate()::__2,void>
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  std::function<void(helics::ActionMessage&&)>::
  function<helics::CommonCore::generateTranslatorFederate()::__3,void>
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  TranslatorFederate::setCallbacks
            (in_stack_fffffffffffffd30,
             (function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffd10);
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x485792);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x48579f);
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x4857ac);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x4857b9);
  TranslatorFederate::setHandleManager(in_RDI->translatorFed,&in_RDI->loopHandles);
  std::
  function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::function<helics::CommonCore::generateTranslatorFederate()::__4,void>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  TranslatorFederate::setLogger
            ((TranslatorFederate *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x485828);
  pTVar3 = in_RDI->translatorFed;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x28);
  std::function<void(helics::ActionMessage&)>::
  function<helics::CommonCore::generateTranslatorFederate()::__5,void>
            ((function<void_(helics::ActionMessage_&)> *)in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08);
  TranslatorFederate::setDeliver
            ((TranslatorFederate *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (function<void_(helics::ActionMessage_&)> *)
             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::function<void_(helics::ActionMessage_&)>::~function
            ((function<void_(helics::ActionMessage_&)> *)0x48587c);
  this_00 = (CommonCore *)local_168;
  std::function<gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>&(int)>::
  function<helics::CommonCore::generateTranslatorFederate()::__6,void>
            ((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
              *)in_RDI->translatorFed,in_stack_fffffffffffffd08);
  TranslatorFederate::setAirLockFunction
            ((TranslatorFederate *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
              *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  ~function((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)0x4858d0);
  M = &local_228;
  ActionMessage::ActionMessage((ActionMessage *)pTVar3,(action_t)((ulong)this_00 >> 0x20));
  setActionFlag<helics::ActionMessage,helics::TimingFlags>(M,child_flag);
  setActionFlag<helics::ActionMessage,helics::ConnectionFlags>(&local_228,non_counting_flag);
  local_230 = 0;
  GlobalFederateId::GlobalFederateId(&local_22c,(GlobalBrokerId)0x0);
  local_228.dest_id.gid = local_22c.gid;
  GlobalFederateId::GlobalFederateId
            (&local_234,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
  local_228.source_id.gid = local_234.gid;
  BVar1 = GlobalFederateId::baseValue(local_c);
  ActionMessage::setExtraData
            ((ActionMessage *)CONCAT44(BVar1,in_stack_fffffffffffffd00),in_stack_fffffffffffffcfc);
  getIdentifier_abi_cxx11_(in_RDI);
  std::operator+(__lhs,(char *)pTVar3);
  global_fedid.gid = (BaseType)pTVar3;
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(BVar1,in_stack_fffffffffffffd00));
  name._M_len._4_4_ = in_stack_fffffffffffffcfc;
  name._M_len._0_4_ = in_stack_fffffffffffffcf8;
  name._M_str._0_4_ = in_stack_fffffffffffffd00;
  name._M_str._4_4_ = BVar1;
  ActionMessage::name((ActionMessage *)0x4859f3,name);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(BVar1,in_stack_fffffffffffffd00));
  GlobalFederateId::GlobalFederateId
            (&local_270,(GlobalBrokerId)(in_RDI->super_BrokerBase).higher_broker_id.gid);
  rVar2 = getRoute(this_00,global_fedid);
  local_26c = rVar2.rid;
  (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,(ulong)(uint)rVar2.rid,&local_228);
  if (((in_RDI->super_BrokerBase).globalTime & 1U) != 0) {
    TranslatorFederate::useGlobalTimeCoordinator(in_RDI->translatorFed,true);
  }
  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(BVar1,rVar2.rid));
  return;
}

Assistant:

void CommonCore::generateTranslatorFederate()
{
    auto fid = translatorFedID.load();

    translatorFed =
        new TranslatorFederate(fid, getIdentifier() + "_translators", global_broker_id_local, this);
    translatorThread.store(std::this_thread::get_id());
    translatorFedID.store(fid);

    translatorFed->setCallbacks([this](const ActionMessage& message) { addActionMessage(message); },
                                [this](ActionMessage&& message) {
                                    addActionMessage(std::move(message));
                                },
                                [this](const ActionMessage& message) { routeMessage(message); },
                                [this](ActionMessage&& message) {
                                    routeMessage(std::move(message));
                                });

    translatorFed->setHandleManager(&loopHandles);
    translatorFed->setLogger([this](int level, std::string_view name, std::string_view message) {
        sendToLogger(global_broker_id_local, level, name, message);
    });
    translatorFed->setDeliver([this](ActionMessage& message) { deliverMessage(message); });
    translatorFed->setAirLockFunction([this](int index) { return std::ref(dataAirlocks[index]); });
    ActionMessage newFed(CMD_REG_FED);
    setActionFlag(newFed, child_flag);
    setActionFlag(newFed, non_counting_flag);
    newFed.dest_id = parent_broker_id;
    newFed.source_id = global_broker_id_local;
    newFed.setExtraData(fid.baseValue());
    newFed.name(getIdentifier() + "_translators");
    transmit(getRoute(higher_broker_id), newFed);
    if (globalTime) {
        translatorFed->useGlobalTimeCoordinator(true);
    }
}